

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O0

HTMLElement * __thiscall choc::html::HTMLElement::setClass(HTMLElement *this,string_view value)

{
  string_view value_00;
  HTMLElement *pHVar1;
  allocator<char> local_41;
  string local_40;
  HTMLElement *local_20;
  HTMLElement *this_local;
  string_view value_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (HTMLElement *)value._M_len;
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"class",&local_41);
  value_00._M_str = (char *)value_local._M_len;
  value_00._M_len = (size_t)this_local;
  pHVar1 = setProperty(this,&local_40,value_00);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return pHVar1;
}

Assistant:

HTMLElement& setClass (std::string_view value)      { return setProperty ("class", std::move (value)); }